

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

MethodHandle * __thiscall
jsonrpccxx::GetHandle<int,int,int>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,function<int_(int,_int)> *f)

{
  function<int_(int,_int)> *method;
  function<int_(int,_int)> local_38;
  jsonrpccxx *local_18;
  function<int_(int,_int)> *f_local;
  
  local_18 = this;
  f_local = (function<int_(int,_int)> *)__return_storage_ptr__;
  std::function<int_(int,_int)>::function(&local_38,(function<int_(int,_int)> *)this);
  methodHandle<int,int,int>(__return_storage_ptr__,(jsonrpccxx *)&local_38,method);
  std::function<int_(int,_int)>::~function(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(std::function<ReturnType(ParamTypes...)> f) {
    return methodHandle(f);
  }